

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::ChBody(ChBody *this,ChBody *other)

{
  element_type *peVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [64];
  __shared_ptr<chrono::collision::ChCollisionModelBullet,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  ChBodyFrame::ChBodyFrame(&this->super_ChBodyFrame,&other->super_ChBodyFrame);
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)0x114fb98;
  (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)0x114fe98;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)0x114ff30;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1150068;
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->collision_model).
  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar5 = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])((this->gyro).m_data + 2) = auVar5;
  this->marklist =
       (vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
        )auVar5._0_24_;
  this->forcelist =
       (vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       )auVar5._24_24_;
  (this->gyro).m_data[0] = (double)auVar5._48_8_;
  (this->gyro).m_data[1] = (double)auVar5._56_8_;
  *(undefined1 (*) [64])((this->Xtorque).m_data + 1) = auVar5;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  this->bflags = other->bflags;
  ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  (this->variables).super_ChVariablesBody.user_data = this;
  if (other != this) {
    (this->gyro).m_data[0] = (other->gyro).m_data[0];
    (this->gyro).m_data[1] = (other->gyro).m_data[1];
    (this->gyro).m_data[2] = (other->gyro).m_data[2];
  }
  RemoveAllForces(this);
  RemoveAllMarkers(this);
  (this->super_ChPhysicsItem).super_ChObj.ChTime = (other->super_ChPhysicsItem).super_ChObj.ChTime;
  std::make_shared<chrono::collision::ChCollisionModelBullet>();
  std::__shared_ptr<chrono::collision::ChCollisionModel,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::collision::ChCollisionModel,(__gnu_cxx::_Lock_policy)2> *)
             &this->collision_model,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  peVar1 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_ChCollisionModel[0x16])(peVar1,&this->super_ChContactable_1vars<6>);
  this->density = other->density;
  this->sleep_starttime = other->sleep_starttime;
  fVar2 = other->max_wvel;
  fVar3 = other->sleep_time;
  fVar4 = other->sleep_minspeed;
  this->max_speed = other->max_speed;
  this->max_wvel = fVar2;
  this->sleep_time = fVar3;
  this->sleep_minspeed = fVar4;
  this->sleep_minwvel = other->sleep_minwvel;
  return;
}

Assistant:

ChBody::ChBody(const ChBody& other) : ChPhysicsItem(other), ChBodyFrame(other) {
    bflags = other.bflags;

    variables = other.variables;
    variables.SetUserData((void*)this);

    gyro = other.gyro;

    RemoveAllForces();   // also copy-duplicate the forces? Let the user handle this..
    RemoveAllMarkers();  // also copy-duplicate the markers? Let the user handle this..

    ChTime = other.ChTime;

    // also copy-duplicate the collision model? Let the user handle this..
    collision_model = chrono_types::make_shared<ChCollisionModelBullet>();
    collision_model->SetContactable(this);

    density = other.density;

    max_speed = other.max_speed;
    max_wvel = other.max_wvel;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}